

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * __thiscall
soul::repeatedCharacter_abi_cxx11_(string *__return_storage_ptr__,soul *this,char c,size_t num)

{
  size_t num_local;
  char c_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,c);
  return __return_storage_ptr__;
}

Assistant:

std::string repeatedCharacter (char c, size_t num)
{
    std::string s;
    s.resize (num, c);
    return s;
}